

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5TokendataIterDelete(Fts5TokenDataIter *pSet)

{
  long in_RDI;
  int ii;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != 0) {
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x20); iVar1 = iVar1 + 1) {
      fts5MultiIterFree((Fts5Iter *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
    sqlite3Fts5BufferFree((Fts5Buffer *)0x26b61e);
    sqlite3_free((void *)0x26b62c);
    sqlite3_free((void *)0x26b63a);
    sqlite3_free((void *)0x26b644);
  }
  return;
}

Assistant:

static void fts5TokendataIterDelete(Fts5TokenDataIter *pSet){
  if( pSet ){
    int ii;
    for(ii=0; ii<pSet->nIter; ii++){
      fts5MultiIterFree(pSet->apIter[ii]);
    }
    fts5BufferFree(&pSet->terms);
    sqlite3_free(pSet->aPoslistReader);
    sqlite3_free(pSet->aMap);
    sqlite3_free(pSet);
  }
}